

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void gen_high_BATs(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if ((((env->spr_cb[0x230].name == (char *)0x0) && (env->spr[0x230] == 0)) &&
      (env->spr_cb[0x230].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x230].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x230].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x230].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x230].name = "IBAT4U";
    env->spr_cb[0x230].uea_read = spr_noaccess;
    env->spr_cb[0x230].uea_write = spr_noaccess;
    env->spr_cb[0x230].oea_read = spr_read_ibat_h;
    env->spr_cb[0x230].oea_write = spr_write_ibatu_h;
    env->spr_cb[0x230].hea_read = spr_read_ibat_h;
    env->spr_cb[0x230].hea_write = spr_write_ibatu_h;
    env->spr_cb[0x230].default_value = 0;
    env->spr[0x230] = 0;
    if (((env->spr_cb[0x231].name == (char *)0x0) && (env->spr[0x231] == 0)) &&
       ((env->spr_cb[0x231].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x231].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x231].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x231].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x231].name = "IBAT4L";
      env->spr_cb[0x231].uea_read = spr_noaccess;
      env->spr_cb[0x231].uea_write = spr_noaccess;
      env->spr_cb[0x231].oea_read = spr_read_ibat_h;
      env->spr_cb[0x231].oea_write = spr_write_ibatl_h;
      env->spr_cb[0x231].hea_read = spr_read_ibat_h;
      env->spr_cb[0x231].hea_write = spr_write_ibatl_h;
      env->spr_cb[0x231].default_value = 0;
      env->spr[0x231] = 0;
      if (((env->spr_cb[0x232].name == (char *)0x0) && (env->spr[0x232] == 0)) &&
         (((env->spr_cb[0x232].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x232].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x232].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
          (env->spr_cb[0x232].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
        env->spr_cb[0x232].name = "IBAT5U";
        env->spr_cb[0x232].uea_read = spr_noaccess;
        env->spr_cb[0x232].uea_write = spr_noaccess;
        env->spr_cb[0x232].oea_read = spr_read_ibat_h;
        env->spr_cb[0x232].oea_write = spr_write_ibatu_h;
        env->spr_cb[0x232].hea_read = spr_read_ibat_h;
        env->spr_cb[0x232].hea_write = spr_write_ibatu_h;
        env->spr_cb[0x232].default_value = 0;
        env->spr[0x232] = 0;
        if (((((env->spr_cb[0x233].name == (char *)0x0) && (env->spr[0x233] == 0)) &&
             (env->spr_cb[0x233].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
            ((env->spr_cb[0x233].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
             (env->spr_cb[0x233].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
           (env->spr_cb[0x233].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
          env->spr_cb[0x233].name = "IBAT5L";
          env->spr_cb[0x233].uea_read = spr_noaccess;
          env->spr_cb[0x233].uea_write = spr_noaccess;
          env->spr_cb[0x233].oea_read = spr_read_ibat_h;
          env->spr_cb[0x233].oea_write = spr_write_ibatl_h;
          env->spr_cb[0x233].hea_read = spr_read_ibat_h;
          env->spr_cb[0x233].hea_write = spr_write_ibatl_h;
          env->spr_cb[0x233].default_value = 0;
          env->spr[0x233] = 0;
          if (((env->spr_cb[0x234].name == (char *)0x0) && (env->spr[0x234] == 0)) &&
             ((env->spr_cb[0x234].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
              (((env->spr_cb[0x234].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                (env->spr_cb[0x234].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
               (env->spr_cb[0x234].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
            env->spr_cb[0x234].name = "IBAT6U";
            env->spr_cb[0x234].uea_read = spr_noaccess;
            env->spr_cb[0x234].uea_write = spr_noaccess;
            env->spr_cb[0x234].oea_read = spr_read_ibat_h;
            env->spr_cb[0x234].oea_write = spr_write_ibatu_h;
            env->spr_cb[0x234].hea_read = spr_read_ibat_h;
            env->spr_cb[0x234].hea_write = spr_write_ibatu_h;
            env->spr_cb[0x234].default_value = 0;
            env->spr[0x234] = 0;
            if ((((env->spr_cb[0x235].name == (char *)0x0) && (env->spr[0x235] == 0)) &&
                ((env->spr_cb[0x235].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                 ((env->spr_cb[0x235].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                  (env->spr_cb[0x235].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))))))
               && (env->spr_cb[0x235].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
              env->spr_cb[0x235].name = "IBAT6L";
              env->spr_cb[0x235].uea_read = spr_noaccess;
              env->spr_cb[0x235].uea_write = spr_noaccess;
              env->spr_cb[0x235].oea_read = spr_read_ibat_h;
              env->spr_cb[0x235].oea_write = spr_write_ibatl_h;
              env->spr_cb[0x235].hea_read = spr_read_ibat_h;
              env->spr_cb[0x235].hea_write = spr_write_ibatl_h;
              env->spr_cb[0x235].default_value = 0;
              env->spr[0x235] = 0;
              if ((((env->spr_cb[0x236].name == (char *)0x0) && (env->spr[0x236] == 0)) &&
                  (env->spr_cb[0x236].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                 (((env->spr_cb[0x236].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                   (env->spr_cb[0x236].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                  (env->spr_cb[0x236].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                env->spr_cb[0x236].name = "IBAT7U";
                env->spr_cb[0x236].uea_read = spr_noaccess;
                env->spr_cb[0x236].uea_write = spr_noaccess;
                env->spr_cb[0x236].oea_read = spr_read_ibat_h;
                env->spr_cb[0x236].oea_write = spr_write_ibatu_h;
                env->spr_cb[0x236].hea_read = spr_read_ibat_h;
                env->spr_cb[0x236].hea_write = spr_write_ibatu_h;
                env->spr_cb[0x236].default_value = 0;
                env->spr[0x236] = 0;
                if (((env->spr_cb[0x237].name == (char *)0x0) && (env->spr[0x237] == 0)) &&
                   ((env->spr_cb[0x237].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                    (((env->spr_cb[0x237].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                      (env->spr_cb[0x237].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))
                     && (env->spr_cb[0x237].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)
                     ))))) {
                  env->spr_cb[0x237].name = "IBAT7L";
                  env->spr_cb[0x237].uea_read = spr_noaccess;
                  env->spr_cb[0x237].uea_write = spr_noaccess;
                  env->spr_cb[0x237].oea_read = spr_read_ibat_h;
                  env->spr_cb[0x237].oea_write = spr_write_ibatl_h;
                  env->spr_cb[0x237].hea_read = spr_read_ibat_h;
                  env->spr_cb[0x237].hea_write = spr_write_ibatl_h;
                  env->spr_cb[0x237].default_value = 0;
                  env->spr[0x237] = 0;
                  if (((env->spr_cb[0x238].name == (char *)0x0) && (env->spr[0x238] == 0)) &&
                     (((env->spr_cb[0x238].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                       ((env->spr_cb[0x238].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0
                        && (env->spr_cb[0x238].uea_read ==
                            (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                      (env->spr_cb[0x238].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))
                     ) {
                    env->spr_cb[0x238].name = "DBAT4U";
                    env->spr_cb[0x238].uea_read = spr_noaccess;
                    env->spr_cb[0x238].uea_write = spr_noaccess;
                    env->spr_cb[0x238].oea_read = spr_read_dbat_h;
                    env->spr_cb[0x238].oea_write = spr_write_dbatu_h;
                    env->spr_cb[0x238].hea_read = spr_read_dbat_h;
                    env->spr_cb[0x238].hea_write = spr_write_dbatu_h;
                    env->spr_cb[0x238].default_value = 0;
                    env->spr[0x238] = 0;
                    if (((((env->spr_cb[0x239].name == (char *)0x0) && (env->spr[0x239] == 0)) &&
                         (env->spr_cb[0x239].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)
                         ) && ((env->spr_cb[0x239].oea_write ==
                                (_func_void_DisasContext_ptr_int_int *)0x0 &&
                               (env->spr_cb[0x239].uea_read ==
                                (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                       (env->spr_cb[0x239].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0))
                    {
                      env->spr_cb[0x239].name = "DBAT4L";
                      env->spr_cb[0x239].uea_read = spr_noaccess;
                      env->spr_cb[0x239].uea_write = spr_noaccess;
                      env->spr_cb[0x239].oea_read = spr_read_dbat_h;
                      env->spr_cb[0x239].oea_write = spr_write_dbatl_h;
                      env->spr_cb[0x239].hea_read = spr_read_dbat_h;
                      env->spr_cb[0x239].hea_write = spr_write_dbatl_h;
                      env->spr_cb[0x239].default_value = 0;
                      env->spr[0x239] = 0;
                      if (((env->spr_cb[0x23a].name == (char *)0x0) && (env->spr[0x23a] == 0)) &&
                         ((env->spr_cb[0x23a].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0
                          && (((env->spr_cb[0x23a].oea_write ==
                                (_func_void_DisasContext_ptr_int_int *)0x0 &&
                               (env->spr_cb[0x23a].uea_read ==
                                (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                              (env->spr_cb[0x23a].uea_write ==
                               (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
                        env->spr_cb[0x23a].name = "DBAT5U";
                        env->spr_cb[0x23a].uea_read = spr_noaccess;
                        env->spr_cb[0x23a].uea_write = spr_noaccess;
                        env->spr_cb[0x23a].oea_read = spr_read_dbat_h;
                        env->spr_cb[0x23a].oea_write = spr_write_dbatu_h;
                        env->spr_cb[0x23a].hea_read = spr_read_dbat_h;
                        env->spr_cb[0x23a].hea_write = spr_write_dbatu_h;
                        env->spr_cb[0x23a].default_value = 0;
                        env->spr[0x23a] = 0;
                        if (((env->spr_cb[0x23b].name == (char *)0x0) && (env->spr[0x23b] == 0)) &&
                           (((env->spr_cb[0x23b].oea_read ==
                              (_func_void_DisasContext_ptr_int_int *)0x0 &&
                             ((env->spr_cb[0x23b].oea_write ==
                               (_func_void_DisasContext_ptr_int_int *)0x0 &&
                              (env->spr_cb[0x23b].uea_read ==
                               (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                            (env->spr_cb[0x23b].uea_write ==
                             (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                          env->spr_cb[0x23b].name = "DBAT5L";
                          env->spr_cb[0x23b].uea_read = spr_noaccess;
                          env->spr_cb[0x23b].uea_write = spr_noaccess;
                          env->spr_cb[0x23b].oea_read = spr_read_dbat_h;
                          env->spr_cb[0x23b].oea_write = spr_write_dbatl_h;
                          env->spr_cb[0x23b].hea_read = spr_read_dbat_h;
                          env->spr_cb[0x23b].hea_write = spr_write_dbatl_h;
                          env->spr_cb[0x23b].default_value = 0;
                          env->spr[0x23b] = 0;
                          if ((((env->spr_cb[0x23c].name == (char *)0x0) && (env->spr[0x23c] == 0))
                              && (env->spr_cb[0x23c].oea_read ==
                                  (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                             (((env->spr_cb[0x23c].oea_write ==
                                (_func_void_DisasContext_ptr_int_int *)0x0 &&
                               (env->spr_cb[0x23c].uea_read ==
                                (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                              (env->spr_cb[0x23c].uea_write ==
                               (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                            env->spr_cb[0x23c].name = "DBAT6U";
                            env->spr_cb[0x23c].uea_read = spr_noaccess;
                            env->spr_cb[0x23c].uea_write = spr_noaccess;
                            env->spr_cb[0x23c].oea_read = spr_read_dbat_h;
                            env->spr_cb[0x23c].oea_write = spr_write_dbatu_h;
                            env->spr_cb[0x23c].hea_read = spr_read_dbat_h;
                            env->spr_cb[0x23c].hea_write = spr_write_dbatu_h;
                            env->spr_cb[0x23c].default_value = 0;
                            env->spr[0x23c] = 0;
                            if (((env->spr_cb[0x23d].name == (char *)0x0) && (env->spr[0x23d] == 0))
                               && ((env->spr_cb[0x23d].oea_read ==
                                    (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                   (((env->spr_cb[0x23d].oea_write ==
                                      (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                     (env->spr_cb[0x23d].uea_read ==
                                      (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                                    (env->spr_cb[0x23d].uea_write ==
                                     (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
                              env->spr_cb[0x23d].name = "DBAT6L";
                              env->spr_cb[0x23d].uea_read = spr_noaccess;
                              env->spr_cb[0x23d].uea_write = spr_noaccess;
                              env->spr_cb[0x23d].oea_read = spr_read_dbat_h;
                              env->spr_cb[0x23d].oea_write = spr_write_dbatl_h;
                              env->spr_cb[0x23d].hea_read = spr_read_dbat_h;
                              env->spr_cb[0x23d].hea_write = spr_write_dbatl_h;
                              env->spr_cb[0x23d].default_value = 0;
                              env->spr[0x23d] = 0;
                              if (((env->spr_cb[0x23e].name == (char *)0x0) &&
                                  (env->spr[0x23e] == 0)) &&
                                 (((env->spr_cb[0x23e].oea_read ==
                                    (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                   ((env->spr_cb[0x23e].oea_write ==
                                     (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                    (env->spr_cb[0x23e].uea_read ==
                                     (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                                  (env->spr_cb[0x23e].uea_write ==
                                   (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                                env->spr_cb[0x23e].name = "DBAT7U";
                                env->spr_cb[0x23e].uea_read = spr_noaccess;
                                env->spr_cb[0x23e].uea_write = spr_noaccess;
                                env->spr_cb[0x23e].oea_read = spr_read_dbat_h;
                                env->spr_cb[0x23e].oea_write = spr_write_dbatu_h;
                                env->spr_cb[0x23e].hea_read = spr_read_dbat_h;
                                env->spr_cb[0x23e].hea_write = spr_write_dbatu_h;
                                env->spr_cb[0x23e].default_value = 0;
                                env->spr[0x23e] = 0;
                                if (((((env->spr_cb[0x23f].name == (char *)0x0) &&
                                      (env->spr[0x23f] == 0)) &&
                                     (env->spr_cb[0x23f].oea_read ==
                                      (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                                    ((env->spr_cb[0x23f].oea_write ==
                                      (_func_void_DisasContext_ptr_int_int *)0x0 &&
                                     (env->spr_cb[0x23f].uea_read ==
                                      (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                                   (env->spr_cb[0x23f].uea_write ==
                                    (_func_void_DisasContext_ptr_int_int *)0x0)) {
                                  env->spr_cb[0x23f].name = "DBAT7L";
                                  env->spr_cb[0x23f].uea_read = spr_noaccess;
                                  env->spr_cb[0x23f].uea_write = spr_noaccess;
                                  env->spr_cb[0x23f].oea_read = spr_read_dbat_h;
                                  env->spr_cb[0x23f].oea_write = spr_write_dbatl_h;
                                  env->spr_cb[0x23f].hea_read = spr_read_dbat_h;
                                  env->spr_cb[0x23f].hea_write = spr_write_dbatl_h;
                                  env->spr_cb[0x23f].default_value = 0;
                                  env->spr[0x23f] = 0;
                                  env->nb_BATs = env->nb_BATs + 4;
                                  return;
                                }
                                uVar2 = 0x23f;
                                uVar1 = 0x23f;
                              }
                              else {
                                uVar2 = 0x23e;
                                uVar1 = 0x23e;
                              }
                            }
                            else {
                              uVar2 = 0x23d;
                              uVar1 = 0x23d;
                            }
                          }
                          else {
                            uVar2 = 0x23c;
                            uVar1 = 0x23c;
                          }
                        }
                        else {
                          uVar2 = 0x23b;
                          uVar1 = 0x23b;
                        }
                      }
                      else {
                        uVar2 = 0x23a;
                        uVar1 = 0x23a;
                      }
                    }
                    else {
                      uVar2 = 0x239;
                      uVar1 = 0x239;
                    }
                  }
                  else {
                    uVar2 = 0x238;
                    uVar1 = 0x238;
                  }
                }
                else {
                  uVar2 = 0x237;
                  uVar1 = 0x237;
                }
              }
              else {
                uVar2 = 0x236;
                uVar1 = 0x236;
              }
            }
            else {
              uVar2 = 0x235;
              uVar1 = 0x235;
            }
          }
          else {
            uVar2 = 0x234;
            uVar1 = 0x234;
          }
        }
        else {
          uVar2 = 0x233;
          uVar1 = 0x233;
        }
      }
      else {
        uVar2 = 0x232;
        uVar1 = 0x232;
      }
    }
    else {
      uVar2 = 0x231;
      uVar1 = 0x231;
    }
  }
  else {
    uVar2 = 0x230;
    uVar1 = 0x230;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_high_BATs(CPUPPCState *env)
{
    spr_register(env, SPR_IBAT4U, "IBAT4U",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_ibat_h, &spr_write_ibatu_h,
                 0x00000000);
    spr_register(env, SPR_IBAT4L, "IBAT4L",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_ibat_h, &spr_write_ibatl_h,
                 0x00000000);
    spr_register(env, SPR_IBAT5U, "IBAT5U",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_ibat_h, &spr_write_ibatu_h,
                 0x00000000);
    spr_register(env, SPR_IBAT5L, "IBAT5L",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_ibat_h, &spr_write_ibatl_h,
                 0x00000000);
    spr_register(env, SPR_IBAT6U, "IBAT6U",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_ibat_h, &spr_write_ibatu_h,
                 0x00000000);
    spr_register(env, SPR_IBAT6L, "IBAT6L",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_ibat_h, &spr_write_ibatl_h,
                 0x00000000);
    spr_register(env, SPR_IBAT7U, "IBAT7U",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_ibat_h, &spr_write_ibatu_h,
                 0x00000000);
    spr_register(env, SPR_IBAT7L, "IBAT7L",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_ibat_h, &spr_write_ibatl_h,
                 0x00000000);
    spr_register(env, SPR_DBAT4U, "DBAT4U",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_dbat_h, &spr_write_dbatu_h,
                 0x00000000);
    spr_register(env, SPR_DBAT4L, "DBAT4L",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_dbat_h, &spr_write_dbatl_h,
                 0x00000000);
    spr_register(env, SPR_DBAT5U, "DBAT5U",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_dbat_h, &spr_write_dbatu_h,
                 0x00000000);
    spr_register(env, SPR_DBAT5L, "DBAT5L",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_dbat_h, &spr_write_dbatl_h,
                 0x00000000);
    spr_register(env, SPR_DBAT6U, "DBAT6U",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_dbat_h, &spr_write_dbatu_h,
                 0x00000000);
    spr_register(env, SPR_DBAT6L, "DBAT6L",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_dbat_h, &spr_write_dbatl_h,
                 0x00000000);
    spr_register(env, SPR_DBAT7U, "DBAT7U",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_dbat_h, &spr_write_dbatu_h,
                 0x00000000);
    spr_register(env, SPR_DBAT7L, "DBAT7L",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_dbat_h, &spr_write_dbatl_h,
                 0x00000000);
    env->nb_BATs += 4;
}